

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::access_chain_abi_cxx11_
          (CompilerGLSL *this,uint32_t base,uint32_t *indices,uint32_t count,SPIRType *target_type,
          AccessChainMeta *meta,bool ptr_chain)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  SPIRType *pSVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  undefined7 in_stack_00000009;
  byte in_stack_00000010;
  bool local_141;
  byte local_131;
  ID local_114;
  uint32_t local_110;
  uint32_t local_10c;
  uint32_t requested_stride;
  uint32_t physical_stride;
  SPIRType *pointee_type;
  uint local_f8;
  TypeID type_id;
  AccessChainFlags flags_1;
  string basename;
  undefined1 local_c0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chain;
  uint local_7c;
  undefined1 local_78 [4];
  AccessChainFlags flags;
  bool local_4d;
  uint32_t local_4c;
  uint32_t uStack_48;
  bool need_transpose;
  uint32_t array_stride;
  uint32_t matrix_stride;
  bool ptr_chain_local;
  SPIRType *target_type_local;
  uint32_t *puStack_30;
  uint32_t count_local;
  uint32_t *indices_local;
  CompilerGLSL *pCStack_20;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *ret;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,base);
  puStack_30 = (uint32_t *)CONCAT44(in_register_0000000c,count);
  indices_local._4_4_ = (uint32_t)indices;
  target_type_local._4_4_ = (uint32_t)target_type;
  array_stride._3_1_ = in_stack_00000010 & 1;
  _matrix_stride = meta;
  pCStack_20 = this_00;
  this_local = this;
  sVar3 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this_00->flattened_buffer_blocks,(key_type *)((long)&indices_local + 4));
  if (sVar3 == 0) {
    sVar5 = ::std::
            unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
            ::count(&this_00->flattened_structs,(key_type *)((long)&indices_local + 4));
    if ((sVar5 == 0) || (target_type_local._4_4_ == 0)) {
      local_f8 = 8;
      if ((array_stride._3_1_ & 1) != 0) {
        local_f8 = 0xc;
        uVar2 = Compiler::expression_type_id((Compiler *)this_00,indices_local._4_4_);
        TypedID<(spirv_cross::Types)1>::TypedID
                  ((TypedID<(spirv_cross::Types)1> *)((long)&pointee_type + 4),uVar2);
        local_141 = false;
        if (((this_00->backend).native_pointers & 1U) != 0) {
          TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
                    ((TypedID<(spirv_cross::Types)0> *)&pointee_type,
                     (TypedID<(spirv_cross::Types)1> *)((long)&pointee_type + 4));
          local_141 = Compiler::has_decoration
                                ((Compiler *)this_00,pointee_type._0_4_,DecorationArrayStride);
        }
        if (local_141 != false) {
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&pointee_type + 4));
          pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this_00,uVar2);
          _requested_stride = Compiler::get_pointee_type((Compiler *)this_00,pSVar4);
          local_10c = (*(this_00->super_Compiler)._vptr_Compiler[0x2e])(this_00,_requested_stride);
          TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
                    (&local_114,(TypedID<(spirv_cross::Types)1> *)((long)&pointee_type + 4));
          local_110 = Compiler::get_decoration((Compiler *)this_00,local_114,DecorationArrayStride);
          if (local_10c != local_110) {
            local_f8 = local_f8 | 0x80;
            bVar1 = Compiler::is_vector((Compiler *)this_00,_requested_stride);
            if (bVar1) {
              local_f8 = local_f8 | 0x100;
            }
          }
        }
      }
      access_chain_internal_abi_cxx11_
                (this,base,(uint32_t *)(ulong)indices_local._4_4_,(uint32_t)puStack_30,
                 target_type_local._4_4_,(AccessChainMeta *)(ulong)local_f8);
    }
    else {
      local_7c = 10;
      if ((array_stride._3_1_ & 1) != 0) {
        local_7c = 0xe;
      }
      pmVar6 = ::std::
               unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
               ::operator[](&this_00->flattened_structs,(key_type *)((long)&indices_local + 4));
      if (((*pmVar6 & 1U) != 0) &&
         (local_7c = local_7c | 0x20, CONCAT71(in_stack_00000009,ptr_chain) != 0)) {
        *(bool *)(CONCAT71(in_stack_00000009,ptr_chain) + 7) =
             _matrix_stride[1].storage_physical_type == 0xf;
      }
      access_chain_internal_abi_cxx11_
                ((CompilerGLSL *)local_c0,base,(uint32_t *)(ulong)indices_local._4_4_,
                 (uint32_t)puStack_30,target_type_local._4_4_,(AccessChainMeta *)(ulong)local_7c);
      ::std::__cxx11::string::substr((ulong)(local_c0 + 0x20),(ulong)local_c0);
      ::std::__cxx11::string::~string((string *)local_c0);
      if (CONCAT71(in_stack_00000009,ptr_chain) != 0) {
        *(undefined1 *)(CONCAT71(in_stack_00000009,ptr_chain) + 4) = 0;
        *(undefined1 *)(CONCAT71(in_stack_00000009,ptr_chain) + 5) = 0;
      }
      to_flattened_access_chain_expression_abi_cxx11_((CompilerGLSL *)&flags_1,base);
      type_id.id._3_1_ = 0;
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags_1,
                 (char (*) [2])0x40fecd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c0 + 0x20));
      ParsedIR::sanitize_underscores((string *)this);
      type_id.id._3_1_ = 1;
      ::std::__cxx11::string::~string((string *)&flags_1);
      ::std::__cxx11::string::~string((string *)(local_c0 + 0x20));
    }
  }
  else {
    uStack_48 = 0;
    local_4c = 0;
    local_4d = false;
    pSVar4 = Compiler::expression_type((Compiler *)this_00,indices_local._4_4_);
    flattened_access_chain_offset_abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)local_78,this_00,pSVar4,puStack_30,target_type_local._4_4_,0,0x10,&local_4d,
               &stack0xffffffffffffffb8,&local_4c,(bool)(array_stride._3_1_ & 1));
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)local_78);
    if (CONCAT71(in_stack_00000009,ptr_chain) != 0) {
      local_131 = 0;
      if (BuiltInPointSize < _matrix_stride[1].builtin) {
        local_131 = local_4d;
      }
      *(byte *)(CONCAT71(in_stack_00000009,ptr_chain) + 4) = local_131 & 1;
      *(undefined1 *)(CONCAT71(in_stack_00000009,ptr_chain) + 5) = 0;
    }
    flattened_access_chain_abi_cxx11_
              (this,base,(uint32_t *)(ulong)indices_local._4_4_,(uint32_t)puStack_30,
               (SPIRType *)(ulong)target_type_local._4_4_,(uint32_t)_matrix_stride,0,uStack_48,
               SUB41(local_4c,0));
  }
  return this;
}

Assistant:

string CompilerGLSL::access_chain(uint32_t base, const uint32_t *indices, uint32_t count, const SPIRType &target_type,
                                  AccessChainMeta *meta, bool ptr_chain)
{
	if (flattened_buffer_blocks.count(base))
	{
		uint32_t matrix_stride = 0;
		uint32_t array_stride = 0;
		bool need_transpose = false;
		flattened_access_chain_offset(expression_type(base), indices, count, 0, 16, &need_transpose, &matrix_stride,
		                              &array_stride, ptr_chain);

		if (meta)
		{
			meta->need_transpose = target_type.columns > 1 && need_transpose;
			meta->storage_is_packed = false;
		}

		return flattened_access_chain(base, indices, count, target_type, 0, matrix_stride, array_stride,
		                              need_transpose);
	}
	else if (flattened_structs.count(base) && count > 0)
	{
		AccessChainFlags flags = ACCESS_CHAIN_CHAIN_ONLY_BIT | ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT;
		if (ptr_chain)
			flags |= ACCESS_CHAIN_PTR_CHAIN_BIT;

		if (flattened_structs[base])
		{
			flags |= ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT;
			if (meta)
				meta->flattened_struct = target_type.basetype == SPIRType::Struct;
		}

		auto chain = access_chain_internal(base, indices, count, flags, nullptr).substr(1);
		if (meta)
		{
			meta->need_transpose = false;
			meta->storage_is_packed = false;
		}

		auto basename = to_flattened_access_chain_expression(base);
		auto ret = join(basename, "_", chain);
		ParsedIR::sanitize_underscores(ret);
		return ret;
	}
	else
	{
		AccessChainFlags flags = ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT;
		if (ptr_chain)
		{
			flags |= ACCESS_CHAIN_PTR_CHAIN_BIT;
			// PtrAccessChain could get complicated.
			TypeID type_id = expression_type_id(base);
			if (backend.native_pointers && has_decoration(type_id, DecorationArrayStride))
			{
				// If there is a mismatch we have to go via 64-bit pointer arithmetic :'(
				// Using packed hacks only gets us so far, and is not designed to deal with pointer to
				// random values. It works for structs though.
				auto &pointee_type = get_pointee_type(get<SPIRType>(type_id));
				uint32_t physical_stride = get_physical_type_stride(pointee_type);
				uint32_t requested_stride = get_decoration(type_id, DecorationArrayStride);
				if (physical_stride != requested_stride)
				{
					flags |= ACCESS_CHAIN_PTR_CHAIN_POINTER_ARITH_BIT;
					if (is_vector(pointee_type))
						flags |= ACCESS_CHAIN_PTR_CHAIN_CAST_TO_SCALAR_BIT;
				}
			}
		}

		return access_chain_internal(base, indices, count, flags, meta);
	}
}